

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::MatchSetOrJumpInst::Exec
          (MatchSetOrJumpInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  bool bVar1;
  uint8 *puVar2;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  MatchSetOrJumpInst *this_local;
  
  Matcher::CompStats(matcher);
  if ((*inputOffset < inputLength) &&
     (bVar1 = RuntimeCharSet<char16_t>::Get(&(this->super_SetMixin<false>).set,input[*inputOffset]),
     bVar1)) {
    *inputOffset = *inputOffset + 1;
    *instPointer = *instPointer + 0x2d;
  }
  else {
    puVar2 = Matcher::LabelToInstPointer(matcher,(this->super_JumpMixin).targetLabel);
    *instPointer = puVar2;
  }
  return false;
}

Assistant:

inline bool MatchSetOrJumpInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (inputOffset < inputLength && set.Get(input[inputOffset]))
        {
            inputOffset++;
            instPointer += sizeof(*this);
        }
        else
        {
            instPointer = matcher.LabelToInstPointer(targetLabel);
        }
        return false;
    }